

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::reconfigure(raft_server *this,ptr<cluster_config> *new_config)

{
  int32_t iVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  srv_role sVar5;
  uint uVar6;
  __int_type_conflict _Var7;
  int32 iVar8;
  int32 iVar9;
  int iVar10;
  ulong uVar11;
  size_type sVar12;
  element_type *peVar13;
  element_type *peVar14;
  element_type *peVar15;
  uint *puVar16;
  pointer pvVar17;
  element_type *this_00;
  void **ppvVar18;
  element_type *peVar19;
  ostream *poVar20;
  string *psVar21;
  void *pvVar22;
  element_type *peVar23;
  ulong uVar24;
  ulong uVar25;
  undefined8 uVar26;
  undefined4 *puVar27;
  ulong uVar28;
  char *pcVar29;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<int,_shared_ptr<peer>_>_&&>::value,_pair<iterator,_bool>_>
  _Var30;
  lock_guard<std::mutex> l;
  peer *pp_1;
  pair<const_int,_std::shared_ptr<nuraft::peer>_> *entry_peer;
  iterator __end2;
  iterator __begin2;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *__range2;
  srv_config *s_conf;
  shared_ptr<nuraft::srv_config> *entry;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *__range1;
  stringstream str_buf2;
  CbReturnCode rc_1;
  ptr<cluster_config> c_conf;
  Param local_res5a0;
  void *user_ctx;
  ptr<snapshot_sync_ctx> snp_ctx;
  ptr<peer> *pp;
  peer_itor pit_1;
  CbReturnCode rc;
  Param param;
  int32 srv_removed;
  const_iterator it_3;
  ptr<peer> p;
  executor exec;
  ptr<srv_config> srv_added;
  const_iterator it_2;
  peer_itor it_1;
  peer_itor pit;
  const_iterator it;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *new_srvs;
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  srvs_added;
  vector<int,_std::allocator<int>_> srvs_removed;
  bool invoke_join_cb;
  stringstream str_buf;
  ptr<cluster_config> cur_config;
  memory_order __b;
  undefined4 in_stack_fffffffffffff4a8;
  undefined4 in_stack_fffffffffffff4ac;
  peer *in_stack_fffffffffffff4b0;
  function<void_(int)> *in_stack_fffffffffffff4b8;
  undefined4 in_stack_fffffffffffff4c0;
  undefined4 in_stack_fffffffffffff4c4;
  raft_server *in_stack_fffffffffffff4c8;
  undefined8 in_stack_fffffffffffff4e0;
  undefined4 in_stack_fffffffffffff4e8;
  undefined4 in_stack_fffffffffffff4ec;
  peer *in_stack_fffffffffffff4f8;
  raft_server *in_stack_fffffffffffff500;
  undefined7 in_stack_fffffffffffff530;
  undefined1 in_stack_fffffffffffff537;
  peer *in_stack_fffffffffffff538;
  raft_server *in_stack_fffffffffffff540;
  raft_server *in_stack_fffffffffffff570;
  bool local_869;
  string local_800 [32];
  string local_7e0 [56];
  element_type *local_7a8;
  reference local_7a0;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_798;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_790;
  long local_788;
  element_type *local_780;
  __shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *local_778;
  _Self local_770;
  _Self local_768;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *local_760;
  stringstream local_758 [16];
  ostream local_748 [380];
  ReturnCode local_5cc;
  __shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2> local_5c8;
  Param local_5b8;
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  void *local_4c0;
  __shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> local_4b8;
  string local_4a8 [32];
  shared_ptr<nuraft::peer> *local_488;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_480;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_478;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_470;
  ReturnCode local_464;
  Param local_460;
  string local_448 [36];
  uint local_424;
  int *local_420;
  int *local_418;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_410;
  string local_408 [32];
  string local_3e8 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_3c8;
  undefined1 local_3c0;
  int32 local_3b4;
  code *local_380;
  undefined8 local_378;
  shared_ptr<nuraft::srv_config> *local_328;
  shared_ptr<nuraft::srv_config> *local_320;
  __normal_iterator<const_std::shared_ptr<nuraft::srv_config>_*,_std::vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>_>
  local_318;
  __shared_ptr local_310 [16];
  __shared_ptr local_300 [16];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_2f0;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_2e8;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_2e0;
  string local_2d8 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_2b8;
  int32 local_2ac;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_2a8;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_2a0;
  iterator local_298;
  _List_const_iterator<std::shared_ptr<nuraft::srv_config>_> local_290;
  iterator local_288;
  _List_const_iterator<std::shared_ptr<nuraft::srv_config>_> local_280;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *local_278;
  byte local_239;
  __shared_ptr local_238 [16];
  stringstream local_210 [16];
  ostream local_200 [376];
  string local_88 [32];
  string local_68 [84];
  undefined4 local_14;
  memory_order local_10;
  int local_c;
  undefined4 *local_8;
  
  get_config(in_stack_fffffffffffff4c8);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar2) {
    peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d2e55);
    iVar10 = (**(code **)(*(long *)peVar23 + 0x38))();
    if (3 < iVar10) {
      peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d2e8e);
      peVar13 = std::
                __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1d2ea3);
      uVar24 = cluster_config::get_log_idx(peVar13);
      peVar13 = std::
                __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1d2ec2);
      uVar25 = cluster_config::get_prev_log_idx(peVar13);
      peVar13 = std::
                __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1d2ee1);
      uVar28 = cluster_config::get_log_idx(peVar13);
      peVar13 = std::
                __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1d2f00);
      uVar11 = cluster_config::get_prev_log_idx(peVar13);
      msg_if_given_abi_cxx11_
                ((char *)local_68,
                 "new config log idx %lu, prev log idx %lu, cur config log idx %lu, prev log idx %lu"
                 ,uVar24,uVar25,uVar28,uVar11);
      (**(code **)(*(long *)peVar23 + 0x40))
                (peVar23,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"reconfigure",0x28c,local_68);
      std::__cxx11::string::~string(local_68);
    }
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar2) {
    peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d2ffd);
    iVar10 = (**(code **)(*(long *)peVar23 + 0x38))();
    if (4 < iVar10) {
      peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d3036);
      peVar13 = std::
                __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1d304b);
      cluster_config::get_servers_abi_cxx11_(peVar13);
      sVar12 = std::__cxx11::
               list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
               ::size((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                       *)in_stack_fffffffffffff4b0);
      peVar13 = std::
                __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1d307f);
      uVar24 = cluster_config::get_prev_log_idx(peVar13);
      peVar13 = std::
                __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1d309e);
      uVar25 = cluster_config::get_log_idx(peVar13);
      msg_if_given_abi_cxx11_
                ((char *)local_88,
                 "system is reconfigured to have %zu servers, last config index: %lu, this config index: %lu"
                 ,sVar12,uVar24,uVar25);
      (**(code **)(*(long *)peVar23 + 0x40))
                (peVar23,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"reconfigure",0x291,local_88);
      std::__cxx11::string::~string(local_88);
    }
  }
  std::__cxx11::stringstream::stringstream(local_210);
  std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1d3165);
  local_239 = 0;
  cluster_config::get_server
            ((cluster_config *)CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
             (int)((ulong)in_stack_fffffffffffff4e0 >> 0x20));
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xfffffffffffffdd8);
  local_869 = false;
  if (!bVar2) {
    std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1d31b4);
    cluster_config::get_server
              ((cluster_config *)CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
               (int)((ulong)in_stack_fffffffffffff4e0 >> 0x20));
    local_239 = 1;
    local_869 = std::__shared_ptr::operator_cast_to_bool(local_238);
  }
  if ((local_239 & 1) != 0) {
    std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x1d3214);
  }
  std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x1d3221);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1d323e);
  std::
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  ::vector((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
            *)0x1d324b);
  peVar13 = std::
            __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d3258);
  local_278 = cluster_config::get_servers_abi_cxx11_(peVar13);
  local_288._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
       ::begin((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
  std::_List_const_iterator<std::shared_ptr<nuraft::srv_config>_>::_List_const_iterator
            (&local_280,&local_288);
  while( true ) {
    local_298._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
         ::end((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
    std::_List_const_iterator<std::shared_ptr<nuraft::srv_config>_>::_List_const_iterator
              (&local_290,&local_298);
    bVar2 = std::operator!=(&local_280,&local_290);
    if (!bVar2) break;
    std::_List_const_iterator<std::shared_ptr<nuraft::srv_config>_>::operator*
              ((_List_const_iterator<std::shared_ptr<nuraft::srv_config>_> *)
               in_stack_fffffffffffff4b0);
    peVar15 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d3317);
    local_2ac = srv_config::get_id(peVar15);
    local_2a8._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::find((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8),
                (key_type *)0x1d334b);
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    _Node_const_iterator
              ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)in_stack_fffffffffffff4b0,
               (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *
               )CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
    local_2b8._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
    bVar3 = std::__detail::operator==(&local_2a0,&local_2b8);
    bVar2 = false;
    if (bVar3) {
      iVar10 = *(int *)(in_RDI + 0x38);
      std::_List_const_iterator<std::shared_ptr<nuraft::srv_config>_>::operator*
                ((_List_const_iterator<std::shared_ptr<nuraft::srv_config>_> *)
                 in_stack_fffffffffffff4b0);
      peVar15 = std::
                __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d33e4);
      iVar9 = srv_config::get_id(peVar15);
      bVar2 = iVar10 != iVar9;
    }
    if (bVar2) {
      std::_List_const_iterator<std::shared_ptr<nuraft::srv_config>_>::operator*
                ((_List_const_iterator<std::shared_ptr<nuraft::srv_config>_> *)
                 in_stack_fffffffffffff4b0);
      std::
      vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
      ::push_back((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                   *)CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
                  (value_type *)in_stack_fffffffffffff4b8);
    }
    iVar10 = *(int *)(in_RDI + 0x38);
    std::_List_const_iterator<std::shared_ptr<nuraft::srv_config>_>::operator*
              ((_List_const_iterator<std::shared_ptr<nuraft::srv_config>_> *)
               in_stack_fffffffffffff4b0);
    peVar15 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d34bc);
    iVar9 = srv_config::get_id(peVar15);
    if (iVar10 == iVar9) {
      std::_List_const_iterator<std::shared_ptr<nuraft::srv_config>_>::operator*
                ((_List_const_iterator<std::shared_ptr<nuraft::srv_config>_> *)
                 in_stack_fffffffffffff4b0);
      peVar15 = std::
                __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d34f8);
      iVar9 = srv_config::get_priority(peVar15);
      *(int32 *)(in_RDI + 0x3c) = iVar9;
      *(undefined4 *)(in_RDI + 0x14c) = 0;
      sVar5 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1d3531);
      if ((sVar5 == follower) &&
         (bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff4b8),
         bVar2)) {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar2) {
          peVar23 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d3588);
          iVar10 = (**(code **)(*(long *)peVar23 + 0x38))();
          if (3 < iVar10) {
            peVar23 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1d35c1);
            msg_if_given_abi_cxx11_
                      ((char *)local_2d8,
                       "now this node is the part of cluster, catch-up process is done, clearing the flag"
                      );
            (**(code **)(*(long *)peVar23 + 0x40))
                      (peVar23,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"reconfigure",0x2ac,local_2d8);
            std::__cxx11::string::~string(local_2d8);
          }
        }
        std::atomic<bool>::operator=
                  ((atomic<bool> *)in_stack_fffffffffffff4b0,
                   SUB41((uint)in_stack_fffffffffffff4ac >> 0x18,0));
        restart_election_timer(in_stack_fffffffffffff570);
      }
    }
    std::_List_const_iterator<std::shared_ptr<nuraft::srv_config>_>::operator++(&local_280);
  }
  local_2e8._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::begin((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
  std::__detail::
  _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
              *)in_stack_fffffffffffff4b0,
             (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *)
             CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
  while( true ) {
    local_2f0._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
    bVar2 = std::__detail::operator!=(&local_2e0,&local_2f0);
    iVar10 = (int)((ulong)in_stack_fffffffffffff4e0 >> 0x20);
    if (!bVar2) break;
    std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1d36ff);
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)0x1d3714);
    cluster_config::get_server
              ((cluster_config *)CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
               (int)((ulong)in_stack_fffffffffffff4e0 >> 0x20));
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_300);
    std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x1d3750);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
      operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)0x1d376a);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
                 (value_type_conflict1 *)in_stack_fffffffffffff4b8);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)in_stack_fffffffffffff4b0);
  }
  std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1d379f);
  cluster_config::get_server
            ((cluster_config *)CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),iVar10)
  ;
  bVar2 = std::__shared_ptr::operator_cast_to_bool(local_310);
  std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x1d37df);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
               (value_type_conflict1 *)in_stack_fffffffffffff4b8);
  }
  local_320 = (shared_ptr<nuraft::srv_config> *)
              std::
              vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
              ::begin((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                       *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<nuraft::srv_config>const*,std::vector<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>>
  ::__normal_iterator<std::shared_ptr<nuraft::srv_config>*>
            ((__normal_iterator<const_std::shared_ptr<nuraft::srv_config>_*,_std::vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>_>
              *)in_stack_fffffffffffff4b0,
             (__normal_iterator<std::shared_ptr<nuraft::srv_config>_*,_std::vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
  while( true ) {
    local_328 = (shared_ptr<nuraft::srv_config> *)
                std::
                vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                ::end((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                       *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::shared_ptr<nuraft::srv_config>_*,_std::vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>_>
                        *)in_stack_fffffffffffff4b0,
                       (__normal_iterator<std::shared_ptr<nuraft::srv_config>_*,_std::vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<nuraft::srv_config>_*,_std::vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>_>
    ::operator*(&local_318);
    std::shared_ptr<nuraft::srv_config>::shared_ptr
              (&in_stack_fffffffffffff4b0->config_,
               (shared_ptr<nuraft::srv_config> *)
               CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
    local_380 = handle_hb_timeout;
    local_378 = 0;
    std::bind<void(nuraft::raft_server::*)(int),nuraft::raft_server*,std::_Placeholder<1>const&>
              ((offset_in_raft_server_to_subr *)in_stack_fffffffffffff4b8,
               (raft_server **)in_stack_fffffffffffff4b0,
               (_Placeholder<1> *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
    std::function<void(int)>::
    function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::_Placeholder<1>))(int)>,void>
              ((function<void_(int)> *)CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0)
               ,(_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>))(int)>
                 *)in_stack_fffffffffffff4b8);
    std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator*
              ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)
               in_stack_fffffffffffff4b0);
    cs_new<nuraft::peer,std::shared_ptr<nuraft::srv_config>&,nuraft::context&,std::function<void(int)>&,std::shared_ptr<nuraft::logger>&>
              ((shared_ptr<nuraft::srv_config> *)in_stack_fffffffffffff4c8,
               (context *)CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
               in_stack_fffffffffffff4b8,(shared_ptr<nuraft::logger> *)in_stack_fffffffffffff4b0);
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1d394c);
    peVar14 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d3968);
    (*peVar14->_vptr_log_store[2])();
    peer::set_next_log_idx
              (in_stack_fffffffffffff4b0,
               CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
    poVar20 = std::operator<<(local_200,"add peer ");
    peVar15 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d39c0);
    iVar9 = srv_config::get_id(peVar15);
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar9);
    poVar20 = std::operator<<(poVar20,", ");
    peVar15 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d3a1a);
    psVar21 = srv_config::get_endpoint_abi_cxx11_(peVar15);
    poVar20 = std::operator<<(poVar20,(string *)psVar21);
    poVar20 = std::operator<<(poVar20,", ");
    peVar15 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d3a76);
    bVar2 = srv_config::is_learner(peVar15);
    pcVar29 = "voting member";
    if (bVar2) {
      pcVar29 = "learner";
    }
    poVar20 = std::operator<<(poVar20,pcVar29);
    std::ostream::operator<<(poVar20,std::endl<char,std::char_traits<char>>);
    peVar15 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d3af3);
    local_3b4 = srv_config::get_id(peVar15);
    std::make_pair<int,std::shared_ptr<nuraft::peer>&>
              ((int *)in_stack_fffffffffffff4b8,
               (shared_ptr<nuraft::peer> *)in_stack_fffffffffffff4b0);
    _Var30 = std::
             unordered_map<int,std::shared_ptr<nuraft::peer>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::shared_ptr<nuraft::peer>>>>
             ::insert<std::pair<int,std::shared_ptr<nuraft::peer>>>
                       ((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
                        (pair<int,_std::shared_ptr<nuraft::peer>_> *)in_stack_fffffffffffff4b8);
    local_3c8._M_cur =
         (__node_type *)
         _Var30.first.
         super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
         _M_cur;
    local_3c0 = _Var30.second;
    std::pair<int,_std::shared_ptr<nuraft::peer>_>::~pair
              ((pair<int,_std::shared_ptr<nuraft::peer>_> *)0x1d3b82);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar2) {
      peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d3bb3);
      iVar10 = (**(code **)(*(long *)peVar23 + 0x38))();
      if (3 < iVar10) {
        peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d3bec);
        peVar15 = std::
                  __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d3c01);
        uVar6 = srv_config::get_id(peVar15);
        msg_if_given_abi_cxx11_((char *)local_3e8,"server %d is added to cluster",(ulong)uVar6);
        (**(code **)(*(long *)peVar23 + 0x40))
                  (peVar23,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"reconfigure",0x2d4,local_3e8);
        std::__cxx11::string::~string(local_3e8);
      }
    }
    sVar5 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1d3d22);
    if (sVar5 == leader) {
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1d3d38);
      peer::set_suppress_following_error((peer *)0x1d3d40);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar2) {
        peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d3d73);
        iVar10 = (**(code **)(*(long *)peVar23 + 0x38))();
        if (3 < iVar10) {
          peVar23 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d3dac);
          peVar15 = std::
                    __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1d3dc1);
          uVar6 = srv_config::get_id(peVar15);
          msg_if_given_abi_cxx11_
                    ((char *)local_408,"enable heartbeating for server %d",(ulong)uVar6);
          (**(code **)(*(long *)peVar23 + 0x40))
                    (peVar23,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"reconfigure",0x2d8,local_408);
          std::__cxx11::string::~string(local_408);
        }
      }
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_fffffffffffff4b0);
      enable_hb_for_peer(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x3a0));
      if (bVar2) {
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1d3eaa);
        iVar9 = peer::get_id((peer *)0x1d3eb2);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1d3ec8);
        iVar8 = peer::get_id((peer *)0x1d3ed0);
        if (iVar9 == iVar8) {
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1d3ef8);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1d3f14);
          peer::get_next_log_idx((peer *)0x1d3f1c);
          peer::set_next_log_idx
                    (in_stack_fffffffffffff4b0,
                     CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
          std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::reset
                    ((__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0));
        }
      }
    }
    std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1d3f60);
    std::function<void_(int)>::~function((function<void_(int)> *)0x1d3f6d);
    std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x1d3f7a);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<nuraft::srv_config>_*,_std::vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>_>
    ::operator++(&local_318);
  }
  local_418 = (int *)std::vector<int,_std::allocator<int>_>::begin
                               ((vector<int,_std::allocator<int>_> *)
                                CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffff4b0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
  while( true ) {
    local_420 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffff4b0,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
    if (!bVar2) break;
    puVar16 = (uint *)__gnu_cxx::
                      __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*(&local_410);
    local_424 = *puVar16;
    if ((local_424 == *(uint *)(in_RDI + 0x38)) &&
       (bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff4b8),
       !bVar2)) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar2) {
        peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d4090);
        iVar10 = (**(code **)(*(long *)peVar23 + 0x38))();
        if (3 < iVar10) {
          peVar23 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d40c9);
          uVar6 = *(uint *)(in_RDI + 0x38);
          peVar13 = std::
                    __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1d40f3);
          uVar24 = cluster_config::get_log_idx(peVar13);
          msg_if_given_abi_cxx11_
                    ((char *)local_448,
                     "this server (%d) has been removed from the cluster, will step down itself soon. config log idx %lu"
                     ,(ulong)uVar6,uVar24);
          (**(code **)(*(long *)peVar23 + 0x40))
                    (peVar23,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"reconfigure",0x2e9,local_448);
          std::__cxx11::string::~string(local_448);
        }
      }
      iVar1 = *(int32_t *)(in_RDI + 0x38);
      _Var7 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)in_stack_fffffffffffff4b8);
      cb_func::Param::Param(&local_460,iVar1,_Var7,-1,(void *)0x0);
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1d41e6);
      local_464 = cb_func::call((cb_func *)in_stack_fffffffffffff4b8,
                                (Type)((ulong)in_stack_fffffffffffff4b0 >> 0x20),
                                (Param *)CONCAT44(in_stack_fffffffffffff4ac,
                                                  in_stack_fffffffffffff4a8));
      *(undefined4 *)(in_RDI + 0x14c) = 2;
    }
    local_478._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::find((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8),
                (key_type *)0x1d4244);
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    _Node_const_iterator
              ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)in_stack_fffffffffffff4b0,
               (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *
               )CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
    local_480._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
    bVar2 = std::__detail::operator!=(&local_470,&local_480);
    if (bVar2) {
      pvVar17 = std::__detail::
                _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                ::operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                              *)0x1d42ba);
      local_488 = &pvVar17->second;
      sVar5 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1d42da);
      if ((sVar5 == leader) &&
         (bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x3b8)), bVar2)
         ) {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar2) {
          peVar23 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d4331);
          iVar10 = (**(code **)(*(long *)peVar23 + 0x38))();
          if (3 < iVar10) {
            peVar23 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1d436a);
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d4386);
            uVar6 = peer::get_id((peer *)0x1d438e);
            msg_if_given_abi_cxx11_((char *)local_4a8,"srv_to_leave_: %d",(ulong)uVar6);
            (**(code **)(*(long *)peVar23 + 0x40))
                      (peVar23,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"reconfigure",0x319,local_4a8);
            std::__cxx11::string::~string(local_4a8);
          }
        }
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1d4433);
        peer::get_snapshot_sync_ctx((peer *)in_stack_fffffffffffff4c8);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_4b8);
        if (bVar2) {
          this_00 = std::
                    __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1d4468);
          ppvVar18 = snapshot_sync_ctx::get_user_snp_ctx(this_00);
          local_4c0 = *ppvVar18;
          bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
          if (bVar2) {
            peVar23 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1d44be);
            iVar10 = (**(code **)(*(long *)peVar23 + 0x38))();
            if (3 < iVar10) {
              peVar23 = std::
                        __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x1d44f7);
              peVar19 = std::__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::
                        get(&local_4b8);
              msg_if_given_abi_cxx11_
                        ((char *)local_4e0,
                         "srv_to_leave_ has snapshot context %p and user context %p, destroy them",
                         peVar19,local_4c0);
              (**(code **)(*(long *)peVar23 + 0x40))
                        (peVar23,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                         ,"reconfigure",799,local_4e0);
              std::__cxx11::string::~string(local_4e0);
            }
          }
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    in_stack_fffffffffffff4b0);
          clear_snapshot_sync_ctx(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
        }
        std::shared_ptr<nuraft::snapshot_sync_ctx>::~shared_ptr
                  ((shared_ptr<nuraft::snapshot_sync_ctx> *)0x1d45e0);
      }
      else {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x3b8));
        if ((!bVar2) &&
           (bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318)),
           bVar2)) {
          peVar23 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d4644);
          iVar10 = (**(code **)(*(long *)peVar23 + 0x38))();
          if (3 < iVar10) {
            peVar23 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1d467d);
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d4692);
            uVar6 = peer::get_id((peer *)0x1d469a);
            msg_if_given_abi_cxx11_
                      ((char *)local_500,
                       "srv_to_leave_ is currently empty on config for removing %d",(ulong)uVar6);
            (**(code **)(*(long *)peVar23 + 0x40))
                      (peVar23,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"reconfigure",0x32b,local_500);
            std::__cxx11::string::~string(local_500);
          }
        }
        remove_peer_from_peers(in_stack_fffffffffffff500,(ptr<peer> *)in_stack_fffffffffffff4f8);
        poVar20 = std::operator<<(local_200,"remove peer ");
        pvVar22 = (void *)std::ostream::operator<<(poVar20,local_424);
        std::ostream::operator<<(pvVar22,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar2) {
        peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d47ce);
        iVar10 = (**(code **)(*(long *)peVar23 + 0x38))();
        if (3 < iVar10) {
          peVar23 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d4807);
          msg_if_given_abi_cxx11_
                    ((char *)local_520,"peer %d cannot be found, no action for removing",
                     (ulong)local_424);
          (**(code **)(*(long *)peVar23 + 0x40))
                    (peVar23,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"reconfigure",0x332,local_520);
          std::__cxx11::string::~string(local_520);
        }
      }
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_410);
  }
  std::__cxx11::stringstream::str();
  bVar4 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_540);
  if ((((bVar4 ^ 0xff) & 1) != 0) &&
     (bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318)), bVar2)) {
    peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d4928);
    iVar10 = (**(code **)(*(long *)peVar23 + 0x38))();
    if (3 < iVar10) {
      peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d4961);
      std::__cxx11::stringstream::str();
      uVar26 = std::__cxx11::string::c_str();
      msg_if_given_abi_cxx11_((char *)local_560,"%s",uVar26);
      (**(code **)(*(long *)peVar23 + 0x40))
                (peVar23,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"reconfigure",0x337,local_560);
      std::__cxx11::string::~string(local_560);
      std::__cxx11::string::~string(local_580);
    }
  }
  set_config((raft_server *)CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
             (ptr<cluster_config> *)in_stack_fffffffffffff4b8);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x390));
  if (bVar2) {
    peVar13 = std::
              __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d4a8b);
    uVar24 = cluster_config::get_log_idx(peVar13);
    peVar13 = std::
              __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d4aaa);
    uVar25 = cluster_config::get_log_idx(peVar13);
    if (uVar24 == uVar25) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar2) {
        peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d4b06);
        iVar10 = (**(code **)(*(long *)peVar23 + 0x38))();
        if (3 < iVar10) {
          peVar23 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d4b3f);
          peVar13 = std::
                    __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1d4b5b);
          uVar24 = cluster_config::get_log_idx(peVar13);
          peVar13 = std::
                    __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1d4b81);
          uVar25 = cluster_config::get_prev_log_idx(peVar13);
          msg_if_given_abi_cxx11_
                    ((char *)local_5a0,"clearing uncommitted config at log %lu, prev %lu",uVar24,
                     uVar25);
          (**(code **)(*(long *)peVar23 + 0x40))
                    (peVar23,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"reconfigure",0x341,local_5a0);
          std::__cxx11::string::~string(local_5a0);
        }
      }
      std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0));
    }
  }
  if (local_869 != false) {
    iVar1 = *(int32_t *)(in_RDI + 0x38);
    _Var7 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_fffffffffffff4b8);
    cb_func::Param::Param(&local_5b8,iVar1,_Var7,-1,(void *)0x0);
    get_config(in_stack_fffffffffffff4c8);
    local_5b8.ctx =
         std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::get(&local_5c8);
    std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
              ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1d4cc3);
    local_5cc = cb_func::call((cb_func *)in_stack_fffffffffffff4b8,
                              (Type)((ulong)in_stack_fffffffffffff4b0 >> 0x20),
                              (Param *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8)
                             );
    std::shared_ptr<nuraft::cluster_config>::~shared_ptr
              ((shared_ptr<nuraft::cluster_config> *)0x1d4d00);
  }
  std::__cxx11::stringstream::stringstream(local_758);
  peVar13 = std::
            __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d4d44);
  local_760 = cluster_config::get_servers_abi_cxx11_(peVar13);
  local_768._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
       ::begin((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
  local_770._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
       ::end((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
              *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
  while (bVar2 = std::operator!=(&local_768,&local_770), bVar2) {
    local_778 = &std::_List_iterator<std::shared_ptr<nuraft::srv_config>_>::operator*
                           ((_List_iterator<std::shared_ptr<nuraft::srv_config>_> *)
                            in_stack_fffffffffffff4b0)->
                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>;
    local_780 = std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::get(local_778);
    local_788 = in_RDI + 0x1e0;
    local_790._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::begin((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
    local_798._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
    while (bVar2 = std::__detail::operator!=(&local_790,&local_798), bVar2) {
      local_7a0 = std::__detail::
                  _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  ::operator*((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                               *)0x1d4e46);
      local_7a8 = std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::get
                            (&(local_7a0->second).
                              super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
      peer::get_lock(local_7a8);
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_fffffffffffff4b0,
                 (mutex_type *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
      iVar9 = peer::get_id((peer *)0x1d4ea2);
      iVar8 = srv_config::get_id(local_780);
      if (iVar9 == iVar8) {
        std::shared_ptr<nuraft::srv_config>::shared_ptr
                  (&in_stack_fffffffffffff4b0->config_,
                   (shared_ptr<nuraft::srv_config> *)
                   CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
        peer::set_config(in_stack_fffffffffffff4b0,
                         (ptr<srv_config> *)
                         CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
        std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x1d4f28)
        ;
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1d4f89);
      std::__detail::
      _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::operator++
                ((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)in_stack_fffffffffffff4b0);
    }
    poVar20 = std::operator<<(local_748,"peer ");
    iVar9 = srv_config::get_id(local_780);
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar9);
    poVar20 = std::operator<<(poVar20,", DC ID ");
    iVar9 = srv_config::get_dc_id(local_780);
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar9);
    poVar20 = std::operator<<(poVar20,", ");
    psVar21 = srv_config::get_endpoint_abi_cxx11_(local_780);
    poVar20 = std::operator<<(poVar20,(string *)psVar21);
    poVar20 = std::operator<<(poVar20,", ");
    in_stack_fffffffffffff537 = srv_config::is_learner(local_780);
    pcVar29 = "voting member";
    if ((bool)in_stack_fffffffffffff537) {
      pcVar29 = "learner";
    }
    poVar20 = std::operator<<(poVar20,pcVar29);
    poVar20 = std::operator<<(poVar20,", ");
    iVar9 = srv_config::get_priority(local_780);
    pvVar22 = (void *)std::ostream::operator<<(poVar20,iVar9);
    std::ostream::operator<<(pvVar22,std::endl<char,std::char_traits<char>>);
    std::_List_iterator<std::shared_ptr<nuraft::srv_config>_>::operator++(&local_768);
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar2) {
    peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d51a7);
    iVar10 = (**(code **)(*(long *)peVar23 + 0x38))();
    if (3 < iVar10) {
      peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d51da);
      peVar13 = std::
                __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1d51ec);
      uVar24 = cluster_config::get_log_idx(peVar13);
      peVar13 = std::
                __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1d5208);
      uVar25 = cluster_config::get_prev_log_idx(peVar13);
      std::__cxx11::stringstream::str();
      uVar26 = std::__cxx11::string::c_str();
      uVar6 = *(uint *)(in_RDI + 0x38);
      puVar27 = (undefined4 *)(in_RDI + 0x34);
      local_c = 5;
      local_8 = puVar27;
      local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_c - 1U < 2) {
        local_14 = *puVar27;
      }
      else if (local_c == 5) {
        local_14 = *puVar27;
      }
      else {
        local_14 = *puVar27;
      }
      in_stack_fffffffffffff4c4 = local_14;
      std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1d52fa);
      uVar28 = srv_state::get_term((srv_state *)0x1d5302);
      msg_if_given_abi_cxx11_
                ((char *)local_7e0,
                 "new configuration: log idx %lu, prev log idx %lu\n%smy id: %d, leader: %d, term: %lu"
                 ,uVar24,uVar25,uVar26,(ulong)uVar6,in_stack_fffffffffffff4c4,uVar28);
      (**(code **)(*(long *)peVar23 + 0x40))
                (peVar23,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"reconfigure",0x364,local_7e0);
      std::__cxx11::string::~string(local_7e0);
      std::__cxx11::string::~string(local_800);
    }
  }
  update_target_priority
            ((raft_server *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
  std::__cxx11::stringstream::~stringstream(local_758);
  std::
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  ::~vector((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
             *)CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0));
  std::__cxx11::stringstream::~stringstream(local_210);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x1d542a);
  return;
}

Assistant:

void raft_server::reconfigure(const ptr<cluster_config>& new_config) {
    ptr<cluster_config> cur_config = get_config();
    p_in( "new config log idx %" PRIu64 ", prev log idx %" PRIu64 ", "
          "cur config log idx %" PRIu64 ", prev log idx %" PRIu64,
          new_config->get_log_idx(), new_config->get_prev_log_idx(),
          cur_config->get_log_idx(), cur_config->get_prev_log_idx() );
    p_db( "system is reconfigured to have %zu servers, "
          "last config index: %" PRIu64 ", this config index: %" PRIu64 "",
          new_config->get_servers().size(),
          new_config->get_prev_log_idx(),
          new_config->get_log_idx() );

    std::stringstream str_buf;

    // Compare old and new configs, to check if
    // the configuration change is for adding this node.
    bool invoke_join_cb =
        ( !cur_config->get_server(id_) && new_config->get_server(id_) );

    // we only allow one server to be added or removed at a time
    std::vector<int32> srvs_removed;
    std::vector< ptr<srv_config> > srvs_added;
    std::list< ptr<srv_config> >& new_srvs(new_config->get_servers());
    for ( std::list<ptr<srv_config>>::const_iterator it = new_srvs.begin();
          it != new_srvs.end(); ++it ) {
        peer_itor pit = peers_.find((*it)->get_id());
        if (pit == peers_.end() && id_ != (*it)->get_id()) {
            srvs_added.push_back(*it);
        }
        if (id_ == (*it)->get_id()) {
            my_priority_ = (*it)->get_priority();
            steps_to_down_ = 0;
            if (role_ == srv_role::follower &&
                catching_up_) {
                // If this node is newly added, start election timer
                // without waiting for the next append_entries message.
                p_in("now this node is the part of cluster, "
                     "catch-up process is done, clearing the flag");
                catching_up_ = false;
                restart_election_timer();
            }
        }
    }

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        if (!new_config->get_server(it->first)) {
            srvs_removed.push_back(it->first);
        }
    }

    if (!new_config->get_server(id_)) {
        srvs_removed.push_back(id_);
    }

    // ===== Adding new server =====
    for ( std::vector<ptr<srv_config>>::const_iterator it = srvs_added.begin();
          it != srvs_added.end(); ++it ) {
        ptr<srv_config> srv_added = *it;
        timer_task<int32>::executor exec =
            (timer_task<int32>::executor)
            std::bind( &raft_server::handle_hb_timeout,
                       this,
                       std::placeholders::_1 );
        ptr<peer> p = cs_new< peer,
                              ptr<srv_config>&,
                              context&,
                              timer_task<int32>::executor&,
                              ptr<logger>& >
                            ( srv_added, *ctx_, exec, l_ );
        p->set_next_log_idx(log_store_->next_slot());

        str_buf << "add peer " << srv_added->get_id()
                << ", " << srv_added->get_endpoint()
                << ", " << (srv_added->is_learner() ? "learner" : "voting member")
                << std::endl;

        peers_.insert(std::make_pair(srv_added->get_id(), p));
        p_in("server %d is added to cluster", srv_added->get_id());
        if (role_ == srv_role::leader) {
            // Suppress following RPC error as it is expected.
            p->set_suppress_following_error();
            p_in("enable heartbeating for server %d", srv_added->get_id());
            enable_hb_for_peer(*p);
            if (srv_to_join_ && srv_to_join_->get_id() == p->get_id()) {
                p->set_next_log_idx(srv_to_join_->get_next_log_idx());
                srv_to_join_.reset();
            }
        }
    }

    // ===== Removing server =====
    for ( std::vector<int32>::const_iterator it = srvs_removed.begin();
          it != srvs_removed.end(); ++it ) {
        int32 srv_removed = *it;
        if (srv_removed == id_ && !catching_up_) {
            p_in("this server (%d) has been removed from the cluster, "
                 "will step down itself soon. config log idx %" PRIu64,
                 id_,
                 new_config->get_log_idx());
            // this server is removed from cluster

            // Modified by Jung-Sang Ahn (Oct 25, 2017):
            // Reset cluster config and remove all other peer info.
            // If not, this server will repeatedly request leader
            // election of the cluster that this server doesn't belong
            // to anymore.

            // Modified by Jung-Sang Ahn (Dec 24, 2019):
            // Now we have a persistent flag for election timer,
            // we don't need to append any dummy config log at the end,
            // for the case re-joining this replica to the original cluster.
            //reset_peer_info();

            cb_func::Param param(id_, leader_);
            CbReturnCode rc = ctx_->cb_func_.call( cb_func::RemovedFromCluster,
                                                   &param );
            (void)rc;
            steps_to_down_ = 2;
        }

        peer_itor pit = peers_.find(srv_removed);
        if (pit != peers_.end()) {
            // WARNING:
            //   We should not remove the peer from the list immediately,
            //   due to the issue described below:
            //
            // 0) Let's suppose there are 3 servers: S1, S2, and S3,
            //    where S1 is the leader and S3 is going to leave.
            // 1) Generate a conf log for removing server S3.
            // 2) The conf log is committed by S1 and S2 only.
            // 3) Before delivering the conf log to S3, S1 removes
            //    the S3 peer info from the list.
            // 4) It closes the connection to S3.
            // 5) S3 cannot commit the config (containing removing S3).
            // 6) Callback function for `RemovedFromCluster` will be missing,
            //    but S3 will step down itself after 2 timeout period.
            //
            // To address it, we will remove S3 only after the commit index
            // of the last config is delivered to S3.
            // Also we will have timeout for it. If we fail to deliver the
            // commit index, S3 will be just force removed.
            const ptr<peer>& pp = pit->second;

            if (role_ == srv_role::leader && srv_to_leave_) {
                // If leader, keep the to-be-removed server in peer list
                // until 1) catch-up is done, or 2) timeout.
                p_in("srv_to_leave_: %d", srv_to_leave_->get_id());
                ptr<snapshot_sync_ctx> snp_ctx = srv_to_leave_->get_snapshot_sync_ctx();
                if (snp_ctx) {
                    void* user_ctx = snp_ctx->get_user_snp_ctx();
                    p_in("srv_to_leave_ has snapshot context %p and user context %p, "
                         "destroy them",
                         snp_ctx.get(), user_ctx);
                    clear_snapshot_sync_ctx(*srv_to_leave_);
                }

                // However, if `srv_to_leave_` is NULL,
                // it is replaying old config. We can remove it
                // immediately without setting `srv_to_leave_`.

            } else {
                if (!srv_to_leave_) {
                    p_in("srv_to_leave_ is currently empty "
                         "on config for removing %d",
                         pp->get_id());
                }
                remove_peer_from_peers(pp);

                str_buf << "remove peer " << srv_removed << std::endl;
            }
        } else {
            p_in("peer %d cannot be found, no action for removing", srv_removed);
        }
    }

    if (!str_buf.str().empty()) {
        p_in("%s", str_buf.str().c_str());
    }

    set_config(new_config);

    if ( uncommitted_config_ &&
         uncommitted_config_->get_log_idx() == new_config->get_log_idx() ) {
        // All configs are committed.
        p_in("clearing uncommitted config at log %" PRIu64 ", prev %" PRIu64,
             uncommitted_config_->get_log_idx(),
             uncommitted_config_->get_prev_log_idx());
        uncommitted_config_.reset();
    }

    if (invoke_join_cb) {
        cb_func::Param param(id_, leader_);
        ptr<cluster_config> c_conf = get_config();
        param.ctx = (void*)c_conf.get();
        CbReturnCode rc = ctx_->cb_func_.call(cb_func::JoinedCluster, &param);
        (void)rc;
    }

    std::stringstream str_buf2;
    for (auto& entry: new_config->get_servers()) {
        srv_config* s_conf = entry.get();

        // SHOULD update peer's srv_config.
        for (auto& entry_peer: peers_) {
            peer* pp = entry_peer.second.get();
            std::lock_guard<std::mutex> l(pp->get_lock());
            if (pp->get_id() == s_conf->get_id()) {
                pp->set_config(entry);
            }
        }

        str_buf2 << "peer " << s_conf->get_id()
                 << ", DC ID " << s_conf->get_dc_id()
                 << ", " << s_conf->get_endpoint()
                 << ", " << (s_conf->is_learner() ? "learner" : "voting member")
                 << ", " << s_conf->get_priority()
                 << std::endl;
    }
    p_in("new configuration: log idx %" PRIu64 ", prev log idx %" PRIu64 "\n"
         "%smy id: %d, leader: %d, term: %" PRIu64,
         new_config->get_log_idx(), new_config->get_prev_log_idx(),
         str_buf2.str().c_str(), id_, leader_.load(), state_->get_term());

    update_target_priority();
}